

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  jpeg_d_coef_controller *pjVar7;
  JBLOCKROW output_row;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var8;
  JQUANT_TBL *pJVar9;
  inverse_DCT_method_ptr p_Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  long lVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  JCOEF JVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  JBLOCKARRAY ppaJVar46;
  ulong uVar47;
  long lVar48;
  uint uVar49;
  JBLOCKROW paJVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  int iVar63;
  ulong uVar64;
  int iVar65;
  int iVar66;
  long lVar67;
  int iVar68;
  JDIMENSION JVar69;
  jpeg_component_info *pjVar70;
  long lVar71;
  int iVar72;
  int iVar73;
  bool bVar74;
  int local_248;
  JBLOCKROW local_1d0;
  JBLOCKROW local_1c8;
  JBLOCKROW local_178;
  JBLOCKROW local_170;
  JSAMPARRAY local_158;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong uVar55;
  
  pjVar7 = cinfo->coef;
  JVar69 = cinfo->total_iMCU_rows;
  uVar49 = JVar69 - 1;
  output_row = (JBLOCKROW)pjVar7[3].start_output_pass;
  while( true ) {
    if (((cinfo->output_scan_number < cinfo->input_scan_number) ||
        (cinfo->inputctl->eoi_reached != 0)) ||
       ((cinfo->input_scan_number == cinfo->output_scan_number &&
        ((uint)(cinfo->Ss == 0) * 2 + cinfo->output_iMCU_row < cinfo->input_iMCU_row)))) break;
    iVar41 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar41 == 0) {
      return 0;
    }
  }
  if (0 < cinfo->num_components) {
    pjVar70 = cinfo->comp_info;
    uVar42 = JVar69 - 2;
    lVar67 = 0;
    local_138 = 0;
    local_130 = 0;
    local_128 = 0;
    local_120 = 0;
    do {
      if (pjVar70->component_needed != 0) {
        uVar43 = cinfo->output_iMCU_row;
        if (uVar43 < uVar42) {
          uVar51 = pjVar70->v_samp_factor;
          JVar69 = pjVar70->v_samp_factor * 3;
        }
        else if (uVar43 < uVar49) {
          uVar51 = pjVar70->v_samp_factor;
          JVar69 = pjVar70->v_samp_factor * 2;
        }
        else {
          uVar53 = pjVar70->v_samp_factor;
          uVar51 = pjVar70->height_in_blocks % uVar53;
          JVar69 = uVar51;
          if (uVar51 == 0) {
            uVar51 = uVar53;
            JVar69 = uVar53;
          }
        }
        if (uVar43 < 2) {
          if (uVar43 == 1) {
            ppaJVar46 = (*cinfo->mem->access_virt_barray)
                                  ((j_common_ptr)cinfo,
                                   (jvirt_barray_ptr)(&pjVar7[3].decompress_data)[lVar67],0,JVar69,0
                                  );
            ppaJVar46 = ppaJVar46 + pjVar70->v_samp_factor;
          }
          else {
            ppaJVar46 = (*cinfo->mem->access_virt_barray)
                                  ((j_common_ptr)cinfo,
                                   (jvirt_barray_ptr)(&pjVar7[3].decompress_data)[lVar67],0,JVar69,0
                                  );
          }
        }
        else {
          ppaJVar46 = (*cinfo->mem->access_virt_barray)
                                ((j_common_ptr)cinfo,
                                 (jvirt_barray_ptr)(&pjVar7[3].decompress_data)[lVar67],
                                 (uVar43 - 2) * pjVar70->v_samp_factor,
                                 JVar69 + pjVar70->v_samp_factor * 2,0);
          ppaJVar46 = ppaJVar46 + (long)pjVar70->v_samp_factor * 2;
        }
        lVar29 = lVar67;
        if (cinfo->master->last_good_iMCU_row < cinfo->output_iMCU_row) {
          lVar29 = (long)(int)lVar67 + (long)cinfo->num_components;
        }
        p_Var8 = pjVar7[5].decompress_data;
        if (((((*(int *)(p_Var8 + lVar29 * 0x28 + 4) == -1) &&
              (*(int *)(p_Var8 + lVar29 * 0x28 + 8) == -1)) &&
             (*(int *)(p_Var8 + lVar29 * 0x28 + 0xc) == -1)) &&
            ((*(int *)(p_Var8 + lVar29 * 0x28 + 0x10) == -1 &&
             (*(int *)(p_Var8 + lVar29 * 0x28 + 0x14) == -1)))) &&
           ((*(int *)(p_Var8 + lVar29 * 0x28 + 0x18) == -1 &&
            ((*(int *)(p_Var8 + lVar29 * 0x28 + 0x1c) == -1 &&
             (*(int *)(p_Var8 + lVar29 * 0x28 + 0x20) == -1)))))) {
          bVar74 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x24) == -1;
        }
        else {
          bVar74 = false;
        }
        pJVar9 = pjVar70->quant_table;
        uVar62 = (ulong)pJVar9->quantval[0];
        uVar1 = pJVar9->quantval[1];
        uVar2 = pJVar9->quantval[8];
        uVar3 = pJVar9->quantval[0x10];
        uVar4 = pJVar9->quantval[9];
        uVar5 = pJVar9->quantval[2];
        if (bVar74) {
          local_120 = (ulong)pJVar9->quantval[3];
          local_128 = (ulong)pJVar9->quantval[10];
          local_130 = (ulong)pJVar9->quantval[0x11];
          local_138 = (ulong)pJVar9->quantval[0x18];
        }
        if (0 < (int)uVar51) {
          p_Var10 = cinfo->idct->inverse_DCT[lVar67];
          uVar47 = (ulong)pJVar9->quantval[0] << 8;
          local_158 = output_buf[lVar67];
          uVar64 = 0;
          do {
            uVar43 = cinfo->master->first_MCU_col[lVar67];
            uVar55 = (ulong)uVar43;
            paJVar50 = ppaJVar46[uVar64] + uVar55;
            if ((uVar64 != 0) || (local_1d0 = paJVar50, cinfo->output_iMCU_row != 0)) {
              local_1d0 = ppaJVar46[uVar64 - 1] + uVar55;
            }
            if ((1 < uVar64) || (local_170 = local_1d0, 1 < cinfo->output_iMCU_row)) {
              local_170 = ppaJVar46[uVar64 - 2] + uVar55;
            }
            if (((long)uVar64 < (long)(int)(uVar51 - 1)) ||
               (local_1c8 = paJVar50, cinfo->output_iMCU_row < uVar49)) {
              local_1c8 = ppaJVar46[uVar64 + 1] + uVar55;
            }
            if (((long)uVar64 < (long)(int)(uVar51 - 2)) ||
               (local_178 = local_1c8, cinfo->output_iMCU_row < uVar42)) {
              local_178 = ppaJVar46[uVar64 + 2] + uVar55;
            }
            if (uVar43 <= cinfo->master->last_MCU_col[lVar67]) {
              uVar43 = pjVar70->width_in_blocks - 1;
              iVar41 = (int)(*local_178)[0];
              iVar52 = (int)(*local_1c8)[0];
              iVar59 = (int)(*paJVar50)[0];
              iVar57 = (int)(*local_1d0)[0];
              iVar44 = (int)(*local_170)[0];
              lVar71 = 0;
              JVar69 = 0;
              iVar60 = iVar41;
              local_248 = iVar52;
              iVar30 = iVar41;
              iVar65 = iVar52;
              iVar58 = iVar52;
              iVar66 = iVar59;
              iVar31 = iVar59;
              iVar72 = iVar59;
              iVar39 = iVar57;
              iVar33 = iVar57;
              iVar34 = iVar57;
              iVar35 = iVar44;
              iVar36 = iVar44;
              iVar37 = iVar44;
              iVar38 = iVar41;
              do {
                iVar32 = iVar39;
                iVar56 = iVar66;
                iVar39 = iVar65;
                iVar63 = iVar60;
                jcopy_block_row((JBLOCKROW)((long)*paJVar50 + lVar71),output_row,1);
                uVar53 = (uint)uVar55;
                iVar60 = iVar41;
                iVar65 = iVar52;
                iVar66 = iVar59;
                iVar68 = iVar57;
                iVar73 = iVar44;
                if ((uVar53 == cinfo->master->first_MCU_col[lVar67]) && (uVar53 < uVar43)) {
                  iVar73 = (int)*(short *)((long)local_170[1] + lVar71);
                  iVar68 = (int)*(short *)((long)local_1d0[1] + lVar71);
                  iVar66 = (int)*(short *)((long)paJVar50[1] + lVar71);
                  iVar65 = (int)*(short *)((long)local_1c8[1] + lVar71);
                  iVar60 = (int)*(short *)((long)local_178[1] + lVar71);
                }
                uVar53 = uVar53 + 1;
                uVar55 = (ulong)uVar53;
                if (uVar53 < uVar43) {
                  iVar44 = (int)*(short *)((long)local_170[2] + lVar71);
                  iVar57 = (int)*(short *)((long)local_1d0[2] + lVar71);
                  iVar59 = (int)*(short *)((long)paJVar50[2] + lVar71);
                  iVar52 = (int)*(short *)((long)local_1c8[2] + lVar71);
                  iVar41 = (int)*(short *)((long)local_178[2] + lVar71);
                }
                iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 4);
                if ((iVar6 != 0) && ((*output_row)[1] == 0)) {
                  if (bVar74) {
                    iVar54 = ((iVar32 + iVar58) - (iVar65 + iVar68)) * 0xd + iVar44 +
                             (iVar73 - (iVar38 + iVar30 + iVar36 + iVar35)) + iVar60 +
                             (iVar72 - iVar66) * 0x26;
                    iVar45 = ((iVar57 - (iVar33 + iVar31 + local_248)) + iVar52 + iVar59) * 3 +
                             iVar41;
                  }
                  else {
                    iVar54 = (iVar72 - iVar66) * 0x32;
                    iVar45 = (iVar59 - iVar31) * 7;
                  }
                  lVar48 = (long)(iVar45 + iVar54) * uVar62;
                  if (lVar48 < 0) {
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = (ulong)uVar1 * 0x80 - lVar48;
                    iVar61 = 1 << ((byte)iVar6 & 0x1f);
                    iVar54 = SUB164(auVar16 / (ZEXT216(uVar1) << 8),0);
                    iVar45 = iVar61 + -1;
                    if (iVar54 < iVar61) {
                      iVar45 = iVar54;
                    }
                    if (iVar6 < 1) {
                      iVar45 = iVar54;
                    }
                    JVar40 = -(short)iVar45;
                  }
                  else {
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = lVar48 + (ulong)uVar1 * 0x80;
                    auVar15 = auVar15 / (ZEXT216(uVar1) << 8);
                    JVar40 = auVar15._0_2_;
                    if (0 < iVar6) {
                      iVar54 = 1 << ((byte)iVar6 & 0x1f);
                      iVar45 = auVar15._0_4_;
                      iVar6 = iVar54 + -1;
                      if (iVar45 < iVar54) {
                        iVar6 = iVar45;
                      }
                      JVar40 = (JCOEF)iVar6;
                    }
                  }
                  (*output_row)[1] = JVar40;
                }
                iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 8);
                if ((iVar6 != 0) && ((*output_row)[8] == 0)) {
                  if (bVar74) {
                    iVar45 = ((local_248 - (iVar33 + iVar35)) + iVar30 + (iVar34 - iVar39) * 0x26 +
                              ((iVar32 + iVar68) - (iVar65 + iVar58)) * 0xd +
                             (((iVar38 + iVar63) - (iVar36 + iVar37 + iVar73)) + iVar60) * 3) -
                             (iVar44 + iVar57);
                    iVar54 = iVar41 + iVar52;
                  }
                  else {
                    iVar54 = (iVar34 - iVar39) * 0x32;
                    iVar45 = (iVar63 - iVar37) * 7;
                  }
                  lVar48 = (long)(iVar45 + iVar54) * uVar62;
                  if (lVar48 < 0) {
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = (ulong)uVar2 * 0x80 - lVar48;
                    iVar61 = 1 << ((byte)iVar6 & 0x1f);
                    iVar54 = SUB164(auVar18 / (ZEXT216(uVar2) << 8),0);
                    iVar45 = iVar61 + -1;
                    if (iVar54 < iVar61) {
                      iVar45 = iVar54;
                    }
                    if (iVar6 < 1) {
                      iVar45 = iVar54;
                    }
                    JVar40 = -(short)iVar45;
                  }
                  else {
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = lVar48 + (ulong)uVar2 * 0x80;
                    auVar17 = auVar17 / (ZEXT216(uVar2) << 8);
                    JVar40 = auVar17._0_2_;
                    if (0 < iVar6) {
                      iVar54 = 1 << ((byte)iVar6 & 0x1f);
                      iVar45 = auVar17._0_4_;
                      iVar6 = iVar54 + -1;
                      if (iVar45 < iVar54) {
                        iVar6 = iVar45;
                      }
                      JVar40 = (JCOEF)iVar6;
                    }
                  }
                  (*output_row)[8] = JVar40;
                }
                iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0xc);
                if ((iVar6 != 0) && ((*output_row)[0x10] == 0)) {
                  if (bVar74) {
                    iVar45 = (iVar34 + iVar39) * 7 + iVar63 + iVar56 * -0xe + iVar37 +
                             (iVar66 + iVar72) * -5 + (iVar65 + iVar68 + iVar32 + iVar58) * 2;
                  }
                  else {
                    iVar45 = ((iVar34 + iVar39) * 0xd + iVar56 * -0x18) - (iVar37 + iVar63);
                  }
                  lVar48 = (long)iVar45 * uVar62;
                  if (lVar48 < 0) {
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = (ulong)uVar3 * 0x80 - lVar48;
                    iVar61 = 1 << ((byte)iVar6 & 0x1f);
                    iVar54 = SUB164(auVar20 / (ZEXT216(uVar3) << 8),0);
                    iVar45 = iVar61 + -1;
                    if (iVar54 < iVar61) {
                      iVar45 = iVar54;
                    }
                    if (iVar6 < 1) {
                      iVar45 = iVar54;
                    }
                    JVar40 = -(short)iVar45;
                  }
                  else {
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = lVar48 + (ulong)uVar3 * 0x80;
                    auVar19 = auVar19 / (ZEXT216(uVar3) << 8);
                    JVar40 = auVar19._0_2_;
                    if (0 < iVar6) {
                      iVar54 = 1 << ((byte)iVar6 & 0x1f);
                      iVar45 = auVar19._0_4_;
                      iVar6 = iVar54 + -1;
                      if (iVar45 < iVar54) {
                        iVar6 = iVar45;
                      }
                      JVar40 = (JCOEF)iVar6;
                    }
                  }
                  (*output_row)[0x10] = JVar40;
                }
                iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x10);
                if ((iVar6 != 0) && ((*output_row)[9] == 0)) {
                  iVar45 = (iVar32 - (iVar58 + iVar68)) + iVar65;
                  if (bVar74) {
                    iVar45 = ((iVar30 - iVar35) + iVar44 + iVar45 * 9) - iVar41;
                  }
                  else {
                    iVar45 = ((((local_248 - (iVar36 + iVar33)) + iVar73 + iVar38) - iVar60) +
                              iVar45 * 10 + iVar57) - iVar52;
                  }
                  lVar48 = (long)iVar45 * uVar62;
                  if (lVar48 < 0) {
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = (ulong)uVar4 * 0x80 - lVar48;
                    iVar61 = 1 << ((byte)iVar6 & 0x1f);
                    iVar54 = SUB164(auVar22 / (ZEXT216(uVar4) << 8),0);
                    iVar45 = iVar61 + -1;
                    if (iVar54 < iVar61) {
                      iVar45 = iVar54;
                    }
                    if (iVar6 < 1) {
                      iVar45 = iVar54;
                    }
                    JVar40 = -(short)iVar45;
                  }
                  else {
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = lVar48 + (ulong)uVar4 * 0x80;
                    auVar21 = auVar21 / (ZEXT216(uVar4) << 8);
                    JVar40 = auVar21._0_2_;
                    if (0 < iVar6) {
                      iVar54 = 1 << ((byte)iVar6 & 0x1f);
                      iVar45 = auVar21._0_4_;
                      iVar6 = iVar54 + -1;
                      if (iVar45 < iVar54) {
                        iVar6 = iVar45;
                      }
                      JVar40 = (JCOEF)iVar6;
                    }
                  }
                  (*output_row)[9] = JVar40;
                }
                iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x14);
                if ((iVar6 != 0) && ((*output_row)[2] == 0)) {
                  if (bVar74) {
                    iVar45 = iVar56 * -0xe + iVar31 + (iVar34 + iVar39) * -5 + (iVar66 + iVar72) * 7
                             + (iVar65 + iVar68 + iVar32 + iVar58) * 2 + iVar59;
                  }
                  else {
                    iVar45 = ((iVar66 + iVar72) * 0xd + iVar56 * -0x18) - (iVar59 + iVar31);
                  }
                  lVar48 = (long)iVar45 * uVar62;
                  if (lVar48 < 0) {
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = (ulong)uVar5 * 0x80 - lVar48;
                    iVar61 = 1 << ((byte)iVar6 & 0x1f);
                    iVar54 = SUB164(auVar24 / (ZEXT216(uVar5) << 8),0);
                    iVar45 = iVar61 + -1;
                    if (iVar54 < iVar61) {
                      iVar45 = iVar54;
                    }
                    if (iVar6 < 1) {
                      iVar45 = iVar54;
                    }
                    JVar40 = -(short)iVar45;
                  }
                  else {
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = lVar48 + (ulong)uVar5 * 0x80;
                    auVar23 = auVar23 / (ZEXT216(uVar5) << 8);
                    JVar40 = auVar23._0_2_;
                    if (0 < iVar6) {
                      iVar54 = 1 << ((byte)iVar6 & 0x1f);
                      iVar45 = auVar23._0_4_;
                      iVar6 = iVar54 + -1;
                      if (iVar45 < iVar54) {
                        iVar6 = iVar45;
                      }
                      JVar40 = (JCOEF)iVar6;
                    }
                  }
                  (*output_row)[2] = JVar40;
                }
                if (bVar74) {
                  iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x18);
                  if ((iVar6 != 0) && ((*output_row)[3] == 0)) {
                    lVar48 = (long)((((iVar32 + iVar58) - iVar68) - iVar65) + (iVar72 - iVar66) * 2)
                             * uVar62;
                    if (lVar48 < 0) {
                      iVar61 = 1 << ((byte)iVar6 & 0x1f);
                      iVar54 = (int)((local_120 * 0x80 - lVar48) / (local_120 << 8));
                      iVar45 = iVar61 + -1;
                      if (iVar54 < iVar61) {
                        iVar45 = iVar54;
                      }
                      if (iVar6 < 1) {
                        iVar45 = iVar54;
                      }
                      JVar40 = -(short)iVar45;
                    }
                    else {
                      auVar11._8_4_ = 0;
                      auVar11._0_8_ = local_120 << 8;
                      auVar25._8_4_ = 0;
                      auVar25._0_8_ = lVar48 + local_120 * 0x80;
                      JVar40 = SUB122(auVar25 / auVar11,0);
                      if (0 < iVar6) {
                        iVar54 = 1 << ((byte)iVar6 & 0x1f);
                        iVar45 = SUB124(auVar25 / auVar11,0);
                        iVar6 = iVar54 + -1;
                        if (iVar45 < iVar54) {
                          iVar6 = iVar45;
                        }
                        JVar40 = (JCOEF)iVar6;
                      }
                    }
                    (*output_row)[3] = JVar40;
                  }
                  iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x1c);
                  if ((iVar6 != 0) && ((*output_row)[10] == 0)) {
                    lVar48 = (long)(((iVar32 - iVar58) + iVar68 + (iVar39 - iVar34) * 3) - iVar65) *
                             uVar62;
                    if (lVar48 < 0) {
                      iVar61 = 1 << ((byte)iVar6 & 0x1f);
                      iVar54 = (int)((local_128 * 0x80 - lVar48) / (local_128 << 8));
                      iVar45 = iVar61 + -1;
                      if (iVar54 < iVar61) {
                        iVar45 = iVar54;
                      }
                      if (iVar6 < 1) {
                        iVar45 = iVar54;
                      }
                      JVar40 = -(short)iVar45;
                    }
                    else {
                      auVar12._8_4_ = 0;
                      auVar12._0_8_ = local_128 << 8;
                      auVar26._8_4_ = 0;
                      auVar26._0_8_ = lVar48 + local_128 * 0x80;
                      JVar40 = SUB122(auVar26 / auVar12,0);
                      if (0 < iVar6) {
                        iVar54 = 1 << ((byte)iVar6 & 0x1f);
                        iVar45 = SUB124(auVar26 / auVar12,0);
                        iVar6 = iVar54 + -1;
                        if (iVar45 < iVar54) {
                          iVar6 = iVar45;
                        }
                        JVar40 = (JCOEF)iVar6;
                      }
                    }
                    (*output_row)[10] = JVar40;
                  }
                  iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x20);
                  if ((iVar6 != 0) && ((*output_row)[0x11] == 0)) {
                    lVar48 = (long)((((iVar32 + iVar58) - iVar68) - iVar65) + (iVar66 - iVar72) * 3)
                             * uVar62;
                    if (lVar48 < 0) {
                      iVar61 = 1 << ((byte)iVar6 & 0x1f);
                      iVar54 = (int)((local_130 * 0x80 - lVar48) / (local_130 << 8));
                      iVar45 = iVar61 + -1;
                      if (iVar54 < iVar61) {
                        iVar45 = iVar54;
                      }
                      if (iVar6 < 1) {
                        iVar45 = iVar54;
                      }
                      JVar40 = -(short)iVar45;
                    }
                    else {
                      auVar13._8_4_ = 0;
                      auVar13._0_8_ = local_130 << 8;
                      auVar27._8_4_ = 0;
                      auVar27._0_8_ = lVar48 + local_130 * 0x80;
                      JVar40 = SUB122(auVar27 / auVar13,0);
                      if (0 < iVar6) {
                        iVar54 = 1 << ((byte)iVar6 & 0x1f);
                        iVar45 = SUB124(auVar27 / auVar13,0);
                        iVar6 = iVar54 + -1;
                        if (iVar45 < iVar54) {
                          iVar6 = iVar45;
                        }
                        JVar40 = (JCOEF)iVar6;
                      }
                    }
                    (*output_row)[0x11] = JVar40;
                  }
                  iVar6 = *(int *)(p_Var8 + lVar29 * 0x28 + 0x24);
                  if ((iVar6 != 0) && ((*output_row)[0x18] == 0)) {
                    lVar48 = (long)(((iVar32 - iVar58) + (iVar34 - iVar39) * 2 + iVar68) - iVar65) *
                             uVar62;
                    if (lVar48 < 0) {
                      iVar61 = 1 << ((byte)iVar6 & 0x1f);
                      iVar54 = (int)((local_138 * 0x80 - lVar48) / (local_138 << 8));
                      iVar45 = iVar61 + -1;
                      if (iVar54 < iVar61) {
                        iVar45 = iVar54;
                      }
                      if (iVar6 < 1) {
                        iVar45 = iVar54;
                      }
                      JVar40 = -(short)iVar45;
                    }
                    else {
                      auVar14._8_4_ = 0;
                      auVar14._0_8_ = local_138 << 8;
                      auVar28._8_4_ = 0;
                      auVar28._0_8_ = lVar48 + local_138 * 0x80;
                      JVar40 = SUB122(auVar28 / auVar14,0);
                      if (0 < iVar6) {
                        iVar54 = 1 << ((byte)iVar6 & 0x1f);
                        iVar45 = SUB124(auVar28 / auVar14,0);
                        iVar6 = iVar54 + -1;
                        if (iVar45 < iVar54) {
                          iVar6 = iVar45;
                        }
                        JVar40 = (JCOEF)iVar6;
                      }
                    }
                    (*output_row)[0x18] = JVar40;
                  }
                  lVar48 = (long)((((iVar66 + iVar39 + iVar34 + iVar72) * 0x2a + iVar56 * 0x98) -
                                  ((iVar30 + iVar35 + iVar44 + iVar41) * 2 +
                                  (iVar31 + iVar59 + iVar37 + iVar63) * 8)) +
                                 ((iVar68 + iVar65 + iVar58 + iVar32) -
                                 (iVar36 + iVar73 + iVar60 + iVar33 + local_248 + iVar38 +
                                 iVar52 + iVar57)) * 6);
                  if ((long)(lVar48 * uVar62) < 0) {
                    JVar40 = -(short)(((0x80 - lVar48) * uVar62) / uVar47);
                  }
                  else {
                    JVar40 = (JCOEF)(((lVar48 + 0x80) * uVar62) / uVar47);
                  }
                  (*output_row)[0] = JVar40;
                }
                (*p_Var10)(cinfo,pjVar70,(JCOEFPTR)output_row,local_158,JVar69);
                JVar69 = JVar69 + pjVar70->DCT_scaled_size;
                lVar71 = lVar71 + 0x80;
                local_248 = iVar58;
                iVar30 = iVar38;
                iVar58 = iVar39;
                iVar31 = iVar72;
                iVar72 = iVar56;
                iVar39 = iVar34;
                iVar33 = iVar32;
                iVar34 = iVar68;
                iVar35 = iVar36;
                iVar36 = iVar37;
                iVar37 = iVar73;
                iVar38 = iVar63;
              } while (uVar53 <= cinfo->master->last_MCU_col[lVar67]);
            }
            local_158 = local_158 + pjVar70->DCT_scaled_size;
            uVar64 = uVar64 + 1;
          } while (uVar64 != uVar51);
        }
      }
      lVar67 = lVar67 + 1;
      pjVar70 = pjVar70 + 1;
    } while (lVar67 < cinfo->num_components);
  }
  uVar49 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar49;
  return 4 - (uint)(uVar49 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_smooth_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_prev_block_row, prev_block_row;
  JBLOCKROW next_block_row, next_next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean change_dc;
  JCOEF *workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  JLONG Q00, Q01, Q02, Q03 = 0, Q10, Q11, Q12 = 0, Q20, Q21 = 0, Q30 = 0, num;
  int DC01, DC02, DC03, DC04, DC05, DC06, DC07, DC08, DC09, DC10, DC11, DC12,
      DC13, DC14, DC15, DC16, DC17, DC18, DC19, DC20, DC21, DC22, DC23, DC24,
      DC25;
  int Al, pred;

  /* Keep a local variable to avoid looking it up more than once */
  workspace = coef->workspace;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
         !cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep two rows ahead so that next two block rows' DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 2 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row + delta)
        break;
    }
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row - 1) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 3; /* this and next two iMCU rows */
    } else if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 1) {
      access_rows += 2 * compptr->v_samp_factor; /* prior two iMCU rows too */
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 2) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += 2 * compptr->v_samp_factor; /* point to current iMCU row */
    } else if (cinfo->output_iMCU_row > 0) {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += compptr->v_samp_factor; /* point to current iMCU row */
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (JDIMENSION)0, (JDIMENSION)access_rows, FALSE);
    }
    /* Fetch component-dependent info.
     * If the current scan is incomplete, then we use the component-dependent
     * info from the previous scan.
     */
    if (cinfo->output_iMCU_row > cinfo->master->last_good_iMCU_row)
      coef_bits =
        coef->coef_bits_latch + ((ci + cinfo->num_components) * SAVED_COEFS);
    else
      coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);

    /* We only do DC interpolation if no AC coefficient data is available. */
    change_dc =
      coef_bits[1] == -1 && coef_bits[2] == -1 && coef_bits[3] == -1 &&
      coef_bits[4] == -1 && coef_bits[5] == -1 && coef_bits[6] == -1 &&
      coef_bits[7] == -1 && coef_bits[8] == -1 && coef_bits[9] == -1;

    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    if (change_dc) {
      Q03 = quanttbl->quantval[Q03_POS];
      Q12 = quanttbl->quantval[Q12_POS];
      Q21 = quanttbl->quantval[Q21_POS];
      Q30 = quanttbl->quantval[Q30_POS];
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];

      if (block_row > 0 || cinfo->output_iMCU_row > 0)
        prev_block_row =
          buffer[block_row - 1] + cinfo->master->first_MCU_col[ci];
      else
        prev_block_row = buffer_ptr;

      if (block_row > 1 || cinfo->output_iMCU_row > 1)
        prev_prev_block_row =
          buffer[block_row - 2] + cinfo->master->first_MCU_col[ci];
      else
        prev_prev_block_row = prev_block_row;

      if (block_row < block_rows - 1 || cinfo->output_iMCU_row < last_iMCU_row)
        next_block_row =
          buffer[block_row + 1] + cinfo->master->first_MCU_col[ci];
      else
        next_block_row = buffer_ptr;

      if (block_row < block_rows - 2 ||
          cinfo->output_iMCU_row < last_iMCU_row - 1)
        next_next_block_row =
          buffer[block_row + 2] + cinfo->master->first_MCU_col[ci];
      else
        next_next_block_row = next_block_row;

      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all 25 here so as to do the right thing on narrow pics.
       */
      DC01 = DC02 = DC03 = DC04 = DC05 = (int)prev_prev_block_row[0][0];
      DC06 = DC07 = DC08 = DC09 = DC10 = (int)prev_block_row[0][0];
      DC11 = DC12 = DC13 = DC14 = DC15 = (int)buffer_ptr[0][0];
      DC16 = DC17 = DC18 = DC19 = DC20 = (int)next_block_row[0][0];
      DC21 = DC22 = DC23 = DC24 = DC25 = (int)next_next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        /* Fetch current DCT block into workspace so we can modify it. */
        jcopy_block_row(buffer_ptr, (JBLOCKROW)workspace, (JDIMENSION)1);
        /* Update DC values */
        if (block_num == cinfo->master->first_MCU_col[ci] &&
            block_num < last_block_column) {
          DC04 = (int)prev_prev_block_row[1][0];
          DC09 = (int)prev_block_row[1][0];
          DC14 = (int)buffer_ptr[1][0];
          DC19 = (int)next_block_row[1][0];
          DC24 = (int)next_next_block_row[1][0];
        }
        if (block_num + 1 < last_block_column) {
          DC05 = (int)prev_prev_block_row[2][0];
          DC10 = (int)prev_block_row[2][0];
          DC15 = (int)buffer_ptr[2][0];
          DC20 = (int)next_block_row[2][0];
          DC25 = (int)next_next_block_row[2][0];
        }
        /* If DC interpolation is enabled, compute coefficient estimates using
         * a Gaussian-like kernel, keeping the averages of the DC values.
         *
         * If DC interpolation is disabled, compute coefficient estimates using
         * an algorithm similar to the one described in Section K.8 of the JPEG
         * standard, except applied to a 5x5 window rather than a 3x3 window.
         *
         * An estimate is applied only if the coefficient is still zero and is
         * not known to be fully accurate.
         */
        /* AC01 */
        if ((Al = coef_bits[1]) != 0 && workspace[1] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - DC02 + DC04 + DC05 - 3 * DC06 + 13 * DC07 -
                 13 * DC09 + 3 * DC10 - 3 * DC11 + 38 * DC12 - 38 * DC14 +
                 3 * DC15 - 3 * DC16 + 13 * DC17 - 13 * DC19 + 3 * DC20 -
                 DC21 - DC22 + DC24 + DC25) :
                (-7 * DC11 + 50 * DC12 - 50 * DC14 + 7 * DC15));
          if (num >= 0) {
            pred = (int)(((Q01 << 7) + num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q01 << 7) - num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[1] = (JCOEF)pred;
        }
        /* AC10 */
        if ((Al = coef_bits[2]) != 0 && workspace[8] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - 3 * DC02 - 3 * DC03 - 3 * DC04 - DC05 - DC06 +
                 13 * DC07 + 38 * DC08 + 13 * DC09 - DC10 + DC16 -
                 13 * DC17 - 38 * DC18 - 13 * DC19 + DC20 + DC21 +
                 3 * DC22 + 3 * DC23 + 3 * DC24 + DC25) :
                (-7 * DC03 + 50 * DC08 - 50 * DC18 + 7 * DC23));
          if (num >= 0) {
            pred = (int)(((Q10 << 7) + num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q10 << 7) - num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[8] = (JCOEF)pred;
        }
        /* AC20 */
        if ((Al = coef_bits[3]) != 0 && workspace[16] == 0) {
          num = Q00 * (change_dc ?
                (DC03 + 2 * DC07 + 7 * DC08 + 2 * DC09 - 5 * DC12 - 14 * DC13 -
                 5 * DC14 + 2 * DC17 + 7 * DC18 + 2 * DC19 + DC23) :
                (-DC03 + 13 * DC08 - 24 * DC13 + 13 * DC18 - DC23));
          if (num >= 0) {
            pred = (int)(((Q20 << 7) + num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q20 << 7) - num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[16] = (JCOEF)pred;
        }
        /* AC11 */
        if ((Al = coef_bits[4]) != 0 && workspace[9] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 + DC05 + 9 * DC07 - 9 * DC09 - 9 * DC17 +
                 9 * DC19 + DC21 - DC25) :
                (DC10 + DC16 - 10 * DC17 + 10 * DC19 - DC02 - DC20 + DC22 -
                 DC24 + DC04 - DC06 + 10 * DC07 - 10 * DC09));
          if (num >= 0) {
            pred = (int)(((Q11 << 7) + num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q11 << 7) - num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[9] = (JCOEF)pred;
        }
        /* AC02 */
        if ((Al = coef_bits[5]) != 0 && workspace[2] == 0) {
          num = Q00 * (change_dc ?
                (2 * DC07 - 5 * DC08 + 2 * DC09 + DC11 + 7 * DC12 - 14 * DC13 +
                 7 * DC14 + DC15 + 2 * DC17 - 5 * DC18 + 2 * DC19) :
                (-DC11 + 13 * DC12 - 24 * DC13 + 13 * DC14 - DC15));
          if (num >= 0) {
            pred = (int)(((Q02 << 7) + num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q02 << 7) - num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[2] = (JCOEF)pred;
        }
        if (change_dc) {
          /* AC03 */
          if ((Al = coef_bits[6]) != 0 && workspace[3] == 0) {
            num = Q00 * (DC07 - DC09 + 2 * DC12 - 2 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q03 << 7) + num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q03 << 7) - num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[3] = (JCOEF)pred;
          }
          /* AC12 */
          if ((Al = coef_bits[7]) != 0 && workspace[10] == 0) {
            num = Q00 * (DC07 - 3 * DC08 + DC09 - DC17 + 3 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q12 << 7) + num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q12 << 7) - num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[10] = (JCOEF)pred;
          }
          /* AC21 */
          if ((Al = coef_bits[8]) != 0 && workspace[17] == 0) {
            num = Q00 * (DC07 - DC09 - 3 * DC12 + 3 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q21 << 7) + num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q21 << 7) - num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[17] = (JCOEF)pred;
          }
          /* AC30 */
          if ((Al = coef_bits[9]) != 0 && workspace[24] == 0) {
            num = Q00 * (DC07 + 2 * DC08 + DC09 - DC17 - 2 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q30 << 7) + num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q30 << 7) - num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[24] = (JCOEF)pred;
          }
          /* coef_bits[0] is non-negative.  Otherwise this function would not
           * be called.
           */
          num = Q00 *
                (-2 * DC01 - 6 * DC02 - 8 * DC03 - 6 * DC04 - 2 * DC05 -
                 6 * DC06 + 6 * DC07 + 42 * DC08 + 6 * DC09 - 6 * DC10 -
                 8 * DC11 + 42 * DC12 + 152 * DC13 + 42 * DC14 - 8 * DC15 -
                 6 * DC16 + 6 * DC17 + 42 * DC18 + 6 * DC19 - 6 * DC20 -
                 2 * DC21 - 6 * DC22 - 8 * DC23 - 6 * DC24 - 2 * DC25);
          if (num >= 0) {
            pred = (int)(((Q00 << 7) + num) / (Q00 << 8));
          } else {
            pred = (int)(((Q00 << 7) - num) / (Q00 << 8));
            pred = -pred;
          }
          workspace[0] = (JCOEF)pred;
        }  /* change_dc */

        /* OK, do the IDCT */
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)workspace, output_ptr,
                        output_col);
        /* Advance for next column */
        DC01 = DC02;  DC02 = DC03;  DC03 = DC04;  DC04 = DC05;
        DC06 = DC07;  DC07 = DC08;  DC08 = DC09;  DC09 = DC10;
        DC11 = DC12;  DC12 = DC13;  DC13 = DC14;  DC14 = DC15;
        DC16 = DC17;  DC17 = DC18;  DC18 = DC19;  DC19 = DC20;
        DC21 = DC22;  DC22 = DC23;  DC23 = DC24;  DC24 = DC25;
        buffer_ptr++, prev_block_row++, next_block_row++,
          prev_prev_block_row++, next_next_block_row++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}